

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_TtVarsAreSymmetric(word *pTruth,int nVars,int i,int j,word *pCof0,word *pCof1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  word *pwVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  word *pwVar11;
  
  bVar3 = (byte)j;
  uVar8 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  if ((i < nVars) && (j < nVars)) {
    bVar2 = (byte)i;
    if (uVar8 == 1) {
      *pCof0 = (s_Truths6Neg[i] & *pTruth) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               s_Truths6Neg[i] & *pTruth;
    }
    else if (i < 6) {
      if (0 < (int)uVar8) {
        uVar4 = s_Truths6Neg[i];
        uVar7 = 0;
        do {
          pCof0[uVar7] = (pTruth[uVar7] & uVar4) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                         pTruth[uVar7] & uVar4;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    else if (0 < (int)uVar8) {
      bVar1 = (byte)(i + -6);
      uVar6 = 1 << (bVar1 & 0x1f);
      iVar9 = 2 << (bVar1 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      pwVar5 = pCof0 + (int)uVar6;
      pwVar10 = pCof0;
      pwVar11 = pTruth;
      do {
        if (i + -6 != 0x1f) {
          uVar7 = 0;
          do {
            pwVar10[uVar7] = pwVar11[uVar7];
            pwVar5[uVar7] = pwVar11[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pwVar11 = pwVar11 + iVar9;
        pwVar5 = pwVar5 + iVar9;
        pwVar10 = pwVar10 + iVar9;
      } while (pwVar11 < pTruth + (int)uVar8);
    }
    if (uVar8 == 1) {
      *pCof1 = (s_Truths6[i] & *pTruth) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               s_Truths6[i] & *pTruth;
    }
    else if (i < 6) {
      if (0 < (int)uVar8) {
        uVar4 = s_Truths6[i];
        uVar7 = 0;
        do {
          pCof1[uVar7] = (pTruth[uVar7] & uVar4) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                         pTruth[uVar7] & uVar4;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    else if (0 < (int)uVar8) {
      pwVar5 = pTruth + (int)uVar8;
      bVar2 = (byte)(i + -6);
      uVar6 = 1 << (bVar2 & 0x1f);
      iVar9 = 2 << (bVar2 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      pwVar10 = pCof1;
      do {
        if (i + -6 != 0x1f) {
          uVar7 = 0;
          do {
            pwVar10[uVar7] = pTruth[(long)(int)uVar6 + uVar7];
            pwVar10[(long)(int)uVar6 + uVar7] = pTruth[(long)(int)uVar6 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pTruth = pTruth + iVar9;
        pwVar10 = pwVar10 + iVar9;
      } while (pTruth < pwVar5);
    }
    if (uVar8 == 1) {
      *pCof0 = (s_Truths6[j] & *pCof0) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
               s_Truths6[j] & *pCof0;
    }
    else if (j < 6) {
      if (0 < (int)uVar8) {
        uVar4 = s_Truths6[j];
        uVar7 = 0;
        do {
          pCof0[uVar7] = (pCof0[uVar7] & uVar4) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                         pCof0[uVar7] & uVar4;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    else if (0 < (int)uVar8) {
      bVar2 = (byte)(j + -6);
      uVar6 = 1 << (bVar2 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      pwVar5 = pCof0;
      do {
        if (j + -6 != 0x1f) {
          uVar7 = 0;
          do {
            pwVar5[uVar7] = pwVar5[(long)(int)uVar6 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pwVar5 = pwVar5 + (2 << (bVar2 & 0x1f));
      } while (pwVar5 < pCof0 + (int)uVar8);
    }
    if (uVar8 == 1) {
      *pCof1 = (s_Truths6Neg[j] & *pCof1) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
               s_Truths6Neg[j] & *pCof1;
    }
    else if (j < 6) {
      if (0 < (int)uVar8) {
        uVar4 = s_Truths6Neg[j];
        uVar7 = 0;
        do {
          pCof1[uVar7] = (pCof1[uVar7] & uVar4) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                         pCof1[uVar7] & uVar4;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    else if (0 < (int)uVar8) {
      bVar3 = (byte)(j + -6);
      uVar6 = 1 << (bVar3 & 0x1f);
      iVar9 = 2 << (bVar3 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      pwVar5 = pCof1 + (int)uVar6;
      pwVar10 = pCof1;
      do {
        if (j + -6 != 0x1f) {
          uVar7 = 0;
          do {
            pwVar5[uVar7] = pwVar10[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pwVar10 = pwVar10 + iVar9;
        pwVar5 = pwVar5 + iVar9;
      } while (pwVar10 < pCof1 + (int)uVar8);
    }
    if (0 < (int)uVar8) {
      uVar4 = 0;
      do {
        if (pCof0[uVar4] != pCof1[uVar4]) {
          return 0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
    }
    return 1;
  }
  __assert_fail("i < nVars && j < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xd5e,"int Abc_TtVarsAreSymmetric(word *, int, int, int, word *, word *)");
}

Assistant:

static inline int Abc_TtVarsAreSymmetric( word * pTruth, int nVars, int i, int j, word * pCof0, word * pCof1 )
{
    int nWords = Abc_TtWordNum( nVars );
    assert( i < nVars && j < nVars );
    Abc_TtCofactor0p( pCof0, pTruth, nWords, i );
    Abc_TtCofactor1p( pCof1, pTruth, nWords, i );
    Abc_TtCofactor1( pCof0, nWords, j );
    Abc_TtCofactor0( pCof1, nWords, j );
    return Abc_TtEqual( pCof0, pCof1, nWords );
}